

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void cleanup_world(void)

{
  level_conflict *plVar1;
  store *psVar2;
  town *ptVar3;
  long lVar4;
  store *store;
  level_map_conflict *plVar5;
  long lVar6;
  
  for (plVar5 = maps; plVar5 != (level_map_conflict *)0x0; plVar5 = plVar5->next) {
    if (0 < plVar5->num_levels) {
      lVar4 = 0x40;
      lVar6 = 0;
      do {
        plVar1 = plVar5->levels;
        string_free(*(char **)((long)plVar1 + lVar4 + -0x28));
        string_free(*(char **)((long)plVar1 + lVar4 + -0x20));
        string_free(*(char **)((long)plVar1 + lVar4 + -0x18));
        string_free(*(char **)((long)plVar1 + lVar4 + -0x10));
        string_free(*(char **)((long)plVar1 + lVar4 + -8));
        string_free(*(char **)((long)&plVar1->index + lVar4));
        lVar6 = lVar6 + 1;
        lVar4 = lVar4 + 0x50;
      } while (lVar6 < plVar5->num_levels);
    }
    if (0 < plVar5->num_towns) {
      lVar4 = 0;
      do {
        ptVar3 = plVar5->towns;
        store = ptVar3[lVar4].stores;
        if (ptVar3[lVar4].stores != (store *)0x0) {
          do {
            psVar2 = store->next;
            string_free(store->name);
            free_store(store);
            store = psVar2;
          } while (psVar2 != (store *)0x0);
          ptVar3 = plVar5->towns;
        }
        string_free(ptVar3[lVar4].code);
        lVar4 = lVar4 + 1;
      } while (lVar4 < plVar5->num_towns);
    }
    mem_free(plVar5->towns);
    string_free(plVar5->name);
    string_free(plVar5->help);
    mem_free(plVar5->levels);
  }
  return;
}

Assistant:

static void cleanup_world(void)
{
	int i;
	struct level_map *map = maps;
	while (map) {
		for (i = 0; i < map->num_levels; i++) {
			struct level *level = &map->levels[i];
			string_free(level->north);
			string_free(level->east);
			string_free(level->south);
			string_free(level->west);
			string_free(level->up);
			string_free(level->down);
		}
		for (i = 0; i < map->num_towns; i++) {
			struct town *town = &map->towns[i];
			struct store *store = town->stores, *next;
			while (store) {
				next = store->next;
				string_free((char *)store->name);
				free_store(store);
				store = next;
			}
			string_free(map->towns[i].code);
		}
		mem_free(map->towns);
		string_free(map->name);
		string_free(map->help);
		mem_free(map->levels);
		map = map->next;
	}
}